

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

void putRGBseparate16bittile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *r,uchar *g,uchar *b,uchar *a)

{
  ushort *local_40;
  uint16_t *wb;
  uint16_t *wg;
  uint16_t *wr;
  uint32_t h_local;
  uint32_t w_local;
  uint32_t y_local;
  uint32_t x_local;
  uint32_t *cp_local;
  TIFFRGBAImage *img_local;
  
  wg = (uint16_t *)r;
  wb = (uint16_t *)g;
  local_40 = (ushort *)b;
  _y_local = cp;
  for (wr._0_4_ = h; (uint32_t)wr != 0; wr._0_4_ = (uint32_t)wr - 1) {
    for (w_local = 0; w_local < w; w_local = w_local + 1) {
      *_y_local = CONCAT12(img->Bitdepth16To8[*local_40],
                           CONCAT11(img->Bitdepth16To8[*wb],img->Bitdepth16To8[*wg])) | 0xff000000;
      local_40 = local_40 + 1;
      wb = wb + 1;
      wg = wg + 1;
      _y_local = _y_local + 1;
    }
    wg = wg + fromskew;
    wb = wb + fromskew;
    local_40 = local_40 + fromskew;
    _y_local = _y_local + toskew;
  }
  return;
}

Assistant:

DECLARESepPutFunc(putRGBseparate16bittile)
{
    uint16_t *wr = (uint16_t *)r;
    uint16_t *wg = (uint16_t *)g;
    uint16_t *wb = (uint16_t *)b;
    (void)img;
    (void)y;
    (void)a;
    for (; h > 0; --h)
    {
        for (x = 0; x < w; x++)
            *cp++ = PACK(img->Bitdepth16To8[*wr++], img->Bitdepth16To8[*wg++],
                         img->Bitdepth16To8[*wb++]);
        SKEW(wr, wg, wb, fromskew);
        cp += toskew;
    }
}